

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O0

bool __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::Init
          (SolverApp<TestSolver,_TestNLReader> *this,char **argv,int nl_reader_flags)

{
  bool bVar1;
  int iVar2;
  BasicWriter<char> *this_00;
  size_t sVar3;
  char *__s1;
  TestSolver *in_RDI;
  uint flags;
  char *ext;
  MemoryWriter banner;
  char *filename;
  ASLProblem *in_stack_fffffffffffffd58;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  uint flags_00;
  allocator<char> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  BasicCStringRef<char> in_stack_fffffffffffffd90;
  allocator<char> local_251 [553];
  char *local_28;
  int local_1c [6];
  bool local_1;
  
  internal::Unused<int>(local_1c);
  local_28 = internal::SolverAppOptionParser::Parse
                       ((SolverAppOptionParser *)
                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        (char ***)in_RDI);
  if (local_28 == (char *)0x0) {
    local_1 = false;
  }
  else {
    bVar1 = BasicSolver::ampl_flag
                      ((BasicSolver *)&(in_RDI->super_Solver).super_BasicSolver.super_OutputHandler)
    ;
    if (bVar1) {
      in_stack_fffffffffffffd68 = local_251;
      std::allocator<char>::allocator();
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
                (in_stack_fffffffffffffd80,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::allocator<char>::~allocator(local_251);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffd90,"{}: ");
      this_00 = (BasicWriter<char> *)BasicSolver::long_name((BasicSolver *)0x234ec3);
      fmt::BasicWriter<char>::write<char_const*>
                (this_00,in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd60 =
           (BasicMemoryWriter<char,_std::allocator<char>_> *)
           fmt::BasicWriter<char>::c_str(&in_stack_fffffffffffffd60->super_BasicWriter<char>);
      fputs((char *)in_stack_fffffffffffffd60,_stdout);
      fflush(_stdout);
      sVar3 = fmt::BasicWriter<char>::size((BasicWriter<char> *)0x234f20);
      *(int *)((long)&(in_RDI->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler
              + 4) = (int)sVar3;
      in_RDI[1].super_Solver.super_BasicSolver.version_._M_dataplus = (_Alloc_hider)0x0;
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
                (in_stack_fffffffffffffd60);
    }
    flags_00 = (uint)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[1].super_Solver.super_BasicSolver.super_OutputHandler,local_28);
    std::__cxx11::string::operator=
              ((string *)&in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager,
               (string *)&in_RDI[1].super_Solver.super_BasicSolver.super_OutputHandler);
    __s1 = strrchr(local_28,0x2e);
    if ((__s1 == (char *)0x0) || (iVar2 = strcmp(__s1,".nl"), iVar2 != 0)) {
      std::__cxx11::string::operator+=
                ((string *)&in_RDI[1].super_Solver.super_BasicSolver.super_OutputHandler,".nl");
    }
    else {
      in_stack_fffffffffffffd58 =
           (ASLProblem *)&in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager;
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)in_stack_fffffffffffffd58);
    }
    internal::SetBasename<TestSolver>
              ((TestSolver *)&(in_RDI->super_Solver).super_BasicSolver.super_OutputHandler,
               &in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager);
    internal::SolverAppOptionParser::echo_solver_options
              ((SolverAppOptionParser *)
               &in_RDI[1].super_Solver.super_BasicSolver.super_SolveResultRegistry.registry_._M_t.
                _M_impl.super__Rb_tree_header);
    bVar1 = TestSolver::ParseOptions
                      (in_RDI,(char **)in_stack_fffffffffffffd68,flags_00,in_stack_fffffffffffffd58)
    ;
    if (bVar1) {
      local_1 = true;
    }
    else {
      *(undefined4 *)&(in_RDI->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler
           = 1;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SolverApp<Solver, Reader>::Init(char **argv, int nl_reader_flags) {
  internal::Unused(nl_reader_flags);

  // Parse command-line arguments.
  const char *filename = option_parser_.Parse(argv);
  if (!filename) return false;

  if (solver_.ampl_flag()) {
    fmt::MemoryWriter banner;
    banner.write("{}: ", solver_.long_name());
    std::fputs(banner.c_str(), stdout);
    std::fflush(stdout);
    banner_size = static_cast<unsigned>(banner.size());
    output_handler_.has_output = false;
  }

  // Add .nl extension if necessary.
  nl_filename = filename;
  filename_no_ext = nl_filename;
  const char *ext = std::strrchr(filename, '.');
  if (!ext || std::strcmp(ext, ".nl") != 0)
    nl_filename += ".nl";
  else
    filename_no_ext.resize(filename_no_ext.size() - 3);
  internal::SetBasename(solver_, &filename_no_ext);

  // Parse solver options.
  unsigned flags =
      option_parser_.echo_solver_options() ? 0 : Solver::NO_OPTION_ECHO;
  if (!solver_.ParseOptions(argv, flags)) {
    result_code_ = 1;
    return false;
  }

  return true;
}